

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_cipher_do_ofb(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  long lVar2;
  gost_grasshopper_cipher_ctx *in_RCX;
  byte *in_RDX;
  byte *in_RSI;
  undefined8 in_RDI;
  size_t j;
  size_t i;
  int num;
  uchar *iv;
  uchar *buf;
  uchar *out_ptr;
  uchar *in_ptr;
  gost_grasshopper_cipher_ctx *c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  grasshopper_w128_t *in_stack_ffffffffffffff98;
  ulong uVar3;
  gost_grasshopper_cipher_ctx *ctx_00;
  byte *local_40;
  byte *local_38;
  
  EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  lVar2 = EVP_CIPHER_CTX_buf_noconst(in_RDI);
  EVP_CIPHER_CTX_iv_noconst(in_RDI);
  iVar1 = EVP_CIPHER_CTX_get_num(in_RDI);
  ctx_00 = (gost_grasshopper_cipher_ctx *)0x0;
  local_40 = in_RSI;
  local_38 = in_RDX;
  if (0 < iVar1) {
    ctx_00 = (gost_grasshopper_cipher_ctx *)0x0;
    for (in_stack_ffffffffffffff98 = (grasshopper_w128_t *)(long)iVar1;
        in_stack_ffffffffffffff97 =
             in_stack_ffffffffffffff98 < (grasshopper_w128_t *)0x10 && ctx_00 < in_RCX,
        in_stack_ffffffffffffff98 < (grasshopper_w128_t *)0x10 && ctx_00 < in_RCX;
        in_stack_ffffffffffffff98 = (grasshopper_w128_t *)(in_stack_ffffffffffffff98->b + 1)) {
      *local_40 = in_stack_ffffffffffffff98->b[lVar2] ^ *local_38;
      ctx_00 = (gost_grasshopper_cipher_ctx *)&ctx_00->field_0x1;
      local_38 = local_38 + 1;
      local_40 = local_40 + 1;
    }
    if (in_stack_ffffffffffffff98 != (grasshopper_w128_t *)0x10) {
      EVP_CIPHER_CTX_set_num(in_RDI,(ulong)in_stack_ffffffffffffff98 & 0xffffffff);
      return 1;
    }
    EVP_CIPHER_CTX_set_num(in_RDI,0);
  }
  for (; (gost_grasshopper_cipher_ctx *)((long)&(ctx_00->master_key).k + 8U) < in_RCX;
      ctx_00 = (gost_grasshopper_cipher_ctx *)((ctx_00->master_key).k.b + 8)) {
    gost_grasshopper_cnt_next
              (ctx_00,in_stack_ffffffffffffff98,
               (grasshopper_w128_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    for (in_stack_ffffffffffffff98 = (grasshopper_w128_t *)0x0;
        in_stack_ffffffffffffff98 < (grasshopper_w128_t *)0x10;
        in_stack_ffffffffffffff98 = (grasshopper_w128_t *)(in_stack_ffffffffffffff98->b + 1)) {
      local_40[(long)in_stack_ffffffffffffff98->b] =
           in_stack_ffffffffffffff98->b[lVar2] ^ local_38[(long)in_stack_ffffffffffffff98->b];
    }
    local_38 = local_38 + 0x10;
    local_40 = local_40 + 0x10;
  }
  if (ctx_00 < in_RCX) {
    gost_grasshopper_cnt_next
              (ctx_00,in_stack_ffffffffffffff98,
               (grasshopper_w128_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    uVar3 = 0;
    for (; ctx_00 < in_RCX; ctx_00 = (gost_grasshopper_cipher_ctx *)&ctx_00->field_0x1) {
      local_40[uVar3] = *(byte *)(lVar2 + uVar3) ^ local_38[uVar3];
      uVar3 = uVar3 + 1;
    }
    EVP_CIPHER_CTX_set_num(in_RDI,uVar3 & 0xffffffff);
  }
  else {
    EVP_CIPHER_CTX_set_num(in_RDI,0);
  }
  return 1;
}

Assistant:

static int gost_grasshopper_cipher_do_ofb(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx *c = (gost_grasshopper_cipher_ctx *)
        EVP_CIPHER_CTX_get_cipher_data(ctx);
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    unsigned char *buf = EVP_CIPHER_CTX_buf_noconst(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    int num = EVP_CIPHER_CTX_num(ctx);
    size_t i = 0;
    size_t j;

    /* process partial block if any */
    if (num > 0) {
        for (j = (size_t)num, i = 0; j < GRASSHOPPER_BLOCK_SIZE && i < inl;
             j++, i++, in_ptr++, out_ptr++) {
            *out_ptr = buf[j] ^ (*in_ptr);
        }
        if (j == GRASSHOPPER_BLOCK_SIZE) {
            EVP_CIPHER_CTX_set_num(ctx, 0);
        } else {
            EVP_CIPHER_CTX_set_num(ctx, (int)j);
            return 1;
        }
    }

    for (; i + GRASSHOPPER_BLOCK_SIZE <
         inl;
         i += GRASSHOPPER_BLOCK_SIZE, in_ptr +=
         GRASSHOPPER_BLOCK_SIZE, out_ptr += GRASSHOPPER_BLOCK_SIZE) {
        /*
         * block cipher current iv
         */
        /* Encrypt */
        gost_grasshopper_cnt_next(c, (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) buf);

        /*
         * xor next block of input text with it and output it
         */
        /*
         * output this block
         */
        for (j = 0; j < GRASSHOPPER_BLOCK_SIZE; j++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
    }

    /* Process rest of buffer */
    if (i < inl) {
        gost_grasshopper_cnt_next(c, (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) buf);
        for (j = 0; i < inl; j++, i++) {
            out_ptr[j] = buf[j] ^ in_ptr[j];
        }
        EVP_CIPHER_CTX_set_num(ctx, (int)j);
    } else {
        EVP_CIPHER_CTX_set_num(ctx, 0);
    }

    return 1;
}